

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O0

void pnga_select_elem(Integer g_a,char *op,void *val,Integer *subscript)

{
  bool bVar1;
  int iVar2;
  long in_RCX;
  undefined8 *in_RDX;
  char *in_RSI;
  Integer in_RDI;
  int size_6;
  int size_5;
  int size_4;
  int size_3;
  int size_2;
  int size_1;
  int size;
  int elems_2;
  int elems_1;
  int _i;
  Integer update;
  Integer first_pass;
  _iterator_hdl hdl_a;
  char *cptr;
  void *ptr;
  int local_sync_begin;
  int participate;
  Integer num_blocks;
  elem_info_t new_info;
  elem_info_t info;
  Integer ld [6];
  Integer dims [7];
  Integer hi [7];
  Integer lo [7];
  Integer i;
  Integer ind;
  Integer elems;
  Integer me;
  Integer type;
  Integer ndim;
  undefined4 in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac4;
  undefined4 in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffacc;
  undefined4 in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad4;
  undefined4 in_stack_fffffffffffffad8;
  int in_stack_fffffffffffffadc;
  int in_stack_fffffffffffffae0;
  long local_518;
  Integer *in_stack_fffffffffffffaf8;
  char **in_stack_fffffffffffffb00;
  Integer *in_stack_fffffffffffffb08;
  Integer *in_stack_fffffffffffffb10;
  _iterator_hdl *in_stack_fffffffffffffb18;
  Integer *in_stack_fffffffffffffb38;
  elem_info_t *in_stack_fffffffffffffb40;
  Integer in_stack_fffffffffffffb48;
  void *in_stack_fffffffffffffb50;
  char *in_stack_fffffffffffffb58;
  Integer in_stack_fffffffffffffb60;
  int in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffb74;
  char *in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb84;
  _iterator_hdl *in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb90;
  int in_stack_fffffffffffffb94;
  Integer in_stack_fffffffffffffc58;
  char *in_stack_fffffffffffffc60;
  char *in_stack_fffffffffffffcb8;
  Integer in_stack_fffffffffffffcc0;
  Integer *in_stack_fffffffffffffcc8;
  Integer *in_stack_fffffffffffffcd0;
  Integer *in_stack_fffffffffffffcd8;
  Integer in_stack_fffffffffffffce0;
  undefined4 local_190;
  undefined4 uStack_18c;
  long alStack_188 [7];
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  long local_c8 [8];
  long local_88 [7];
  long local_50;
  long local_48;
  long local_40;
  Integer local_38;
  long local_30;
  long local_28;
  long local_20;
  undefined8 *local_18;
  char *local_10;
  Integer local_8;
  
  iVar2 = _ga_sync_begin;
  local_48 = 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (iVar2 != 0) {
    pnga_sync();
  }
  local_38 = pnga_nodeid();
  pnga_check_handle(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  iVar2 = strncmp(local_10,"min",3);
  if ((iVar2 != 0) && (iVar2 = strncmp(local_10,"max",3), iVar2 != 0)) {
    pnga_error(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  }
  pnga_inquire(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
               in_stack_fffffffffffffcc8);
  pnga_total_blocks(local_8);
  bVar1 = true;
  pnga_local_iterator_init
            (CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),in_stack_fffffffffffffb88
            );
  while (iVar2 = pnga_local_iterator_next
                           (in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,
                            in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
                            in_stack_fffffffffffffaf8), iVar2 != 0) {
    local_40 = (local_c8[local_28 + -1] - local_88[local_28 + -1]) + 1;
    for (iVar2 = 0; (long)iVar2 < local_28 + -1; iVar2 = iVar2 + 1) {
      if (local_c8[(long)iVar2 + -0xe] != (local_c8[iVar2] - local_88[iVar2]) + 1) {
        pnga_error(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      }
      local_40 = ((local_c8[iVar2] - local_88[iVar2]) + 1) * local_40;
    }
    if (bVar1) {
      snga_select_elem(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb50
                       ,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
                       in_stack_fffffffffffffb38);
      for (local_50 = 0; local_50 < local_28; local_50 = local_50 + 1) {
        in_stack_fffffffffffffae0 = ((int)local_c8[local_50] - (int)local_88[local_50]) + 1;
        alStack_188[local_50] = local_48 % (long)in_stack_fffffffffffffae0 + local_88[local_50];
        local_48 = local_48 / (long)in_stack_fffffffffffffae0;
      }
    }
    else {
      snga_select_elem(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb50
                       ,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
                       in_stack_fffffffffffffb38);
      snga_compare_elem(CONCAT44(iVar2,in_stack_fffffffffffffae0),
                        (char *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                        (elem_info_t *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0)
                        ,(elem_info_t *)
                         CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                        (Integer *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
      if (local_518 != 0) {
        for (local_50 = 0; local_50 < local_28; local_50 = local_50 + 1) {
          in_stack_fffffffffffffadc = ((int)local_c8[local_50] - (int)local_88[local_50]) + 1;
          alStack_188[local_50] = local_48 % (long)in_stack_fffffffffffffadc + local_88[local_50];
          local_48 = local_48 / (long)in_stack_fffffffffffffadc;
        }
      }
    }
    bVar1 = false;
  }
  if (local_30 == 0x3e9) {
    armci_msg_sel_scope(in_stack_fffffffffffffb94,in_stack_fffffffffffffb88,
                        in_stack_fffffffffffffb84,in_stack_fffffffffffffb78,
                        in_stack_fffffffffffffb74,in_stack_fffffffffffffb70);
    *(undefined4 *)local_18 = local_190;
  }
  else if (local_30 == 0x3ea) {
    armci_msg_sel_scope(in_stack_fffffffffffffb94,in_stack_fffffffffffffb88,
                        in_stack_fffffffffffffb84,in_stack_fffffffffffffb78,
                        in_stack_fffffffffffffb74,in_stack_fffffffffffffb70);
    *local_18 = CONCAT44(uStack_18c,local_190);
  }
  else if (local_30 == 0x3f8) {
    armci_msg_sel_scope(in_stack_fffffffffffffb94,in_stack_fffffffffffffb88,
                        in_stack_fffffffffffffb84,in_stack_fffffffffffffb78,
                        in_stack_fffffffffffffb74,in_stack_fffffffffffffb70);
    *local_18 = CONCAT44(uStack_18c,local_190);
  }
  else if (local_30 == 0x3ec) {
    armci_msg_sel_scope(in_stack_fffffffffffffb94,in_stack_fffffffffffffb88,
                        in_stack_fffffffffffffb84,in_stack_fffffffffffffb78,
                        in_stack_fffffffffffffb74,in_stack_fffffffffffffb70);
    *local_18 = CONCAT44(uStack_18c,local_190);
  }
  else if (local_30 == 0x3eb) {
    armci_msg_sel_scope(in_stack_fffffffffffffb94,in_stack_fffffffffffffb88,
                        in_stack_fffffffffffffb84,in_stack_fffffffffffffb78,
                        in_stack_fffffffffffffb74,in_stack_fffffffffffffb70);
    *(undefined4 *)local_18 = local_190;
  }
  else if (local_30 == 0x3ee) {
    armci_msg_sel_scope(in_stack_fffffffffffffb94,in_stack_fffffffffffffb88,
                        in_stack_fffffffffffffb84,in_stack_fffffffffffffb78,
                        in_stack_fffffffffffffb74,in_stack_fffffffffffffb70);
    *local_18 = local_140;
  }
  else {
    armci_msg_sel_scope(in_stack_fffffffffffffb94,in_stack_fffffffffffffb88,
                        in_stack_fffffffffffffb84,in_stack_fffffffffffffb78,
                        in_stack_fffffffffffffb74,in_stack_fffffffffffffb70);
    *local_18 = local_150;
    local_18[1] = local_148;
  }
  for (local_50 = 0; local_50 < local_28; local_50 = local_50 + 1) {
    *(long *)(local_20 + local_50 * 8) = alStack_188[local_50];
  }
  return;
}

Assistant:

void pnga_select_elem(Integer g_a, char* op, void* val, Integer *subscript)
{
  Integer ndim, type, me, elems, ind=0, i;
  Integer lo[MAXDIM],hi[MAXDIM],dims[MAXDIM],ld[MAXDIM-1];
  elem_info_t info, new_info;
  Integer num_blocks;
  int     participate=0;
  int local_sync_begin;
  void *ptr;
  char *cptr;
  _iterator_hdl hdl_a;
  Integer first_pass;

  local_sync_begin = _ga_sync_begin; 
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  me = pnga_nodeid();

  pnga_check_handle(g_a, "ga_select_elem");

  if (strncmp(op,"min",3) == 0);
  else if (strncmp(op,"max",3) == 0);
  else pnga_error("operator not recognized",0);

  pnga_inquire(g_a, &type, &ndim, dims);
  num_blocks = pnga_total_blocks(g_a);


  first_pass = 1;
  pnga_local_iterator_init(g_a, &hdl_a);
  while (pnga_local_iterator_next(&hdl_a, lo, hi, &cptr, ld)) {
    Integer update;
    GET_ELEMS(ndim,lo,hi,ld,&elems);
    participate =1;
    ptr = (void*)cptr;

    if (first_pass) {
      /* select local element */
      snga_select_elem(type, op, ptr, elems, &info, &ind);

      /* determine element subscript in the ndim-array */
      for(i = 0; i < ndim; i++){
        int elems = (int)( hi[i]-lo[i]+1);
        info.subscr[i] = ind%elems + lo[i] ;
        ind /= elems;
      }
    } else {
      /* select local element */
      snga_select_elem(type, op, ptr, elems, &new_info, &ind);

      /* compare with old block */
      snga_compare_elem(type,op, &new_info, &info, &update);
      /* determine element subscript in the ndim-array */
      if (update) {
        for(i = 0; i < ndim; i++){
          int elems = (int)( hi[i]-lo[i]+1);
          info.subscr[i] = ind%elems + lo[i] ;
          ind /= elems;
        }
      }
    }
    first_pass = 0;
  }
#if 0
  if (num_blocks < 0) {
    pnga_distribution(g_a, me, lo, hi);

    if ( lo[0]> 0 ){ /* base index is 1: we get 0 if no elements stored on p */

      /******************* calculate local result ************************/
      void    *ptr;
      pnga_access_ptr(g_a, lo, hi, &ptr, ld);
      GET_ELEMS(ndim,lo,hi,ld,&elems);
      participate =1;

      /* select local element */
      snga_select_elem(type, op, ptr, elems, &info, &ind);

      /* release access to the data */
      pnga_release(g_a, lo, hi);

      /* determine element subscript in the ndim-array */
      for(i = 0; i < ndim; i++){
        int elems = (int)( hi[i]-lo[i]+1);
        info.subscr[i] = ind%elems + lo[i] ;
        ind /= elems;
      }
    } 
  } else {
    void *ptr;
    Integer j, offset, jtot, upper;
    Integer nproc = pnga_nnodes();
    pnga_access_block_segment_ptr(g_a, me, &ptr, &elems);
    if (elems > 0) {
      participate =1;

      /* select local element */
      snga_select_elem(type, op, ptr, elems, &info, &ind);

      /* release access to the data */
      pnga_release_block_segment(g_a, me);

      /* convert local index back into a global array index */
      if (!pnga_uses_proc_grid(g_a)) {
        offset = 0;
        for (i=me; i<num_blocks; i += nproc) {
          pnga_distribution(g_a, i, lo, hi);
          jtot = 1;
          for (j=0; j<ndim; j++) {
            jtot *= (hi[j]-lo[j]+1);
          }
          upper = offset + jtot;
          if (ind >= offset && ind < upper) {
            break;
          }  else {
            offset += jtot;
          }
        }
        /* determine element subscript in the ndim-array */
        ind -= offset;
        for(i = 0; i < ndim; i++){
          int elems = (int)( hi[i]-lo[i]+1);
          info.subscr[i] = ind%elems + lo[i] ;
          ind /= elems;
        }
      } else {
        Integer stride[MAXDIM], index[MAXDIM];
        Integer blocks[MAXDIM], block_dims[MAXDIM];
        Integer proc_index[MAXDIM], topology[MAXDIM];
        Integer l_index[MAXDIM];
        Integer min, max;
        pnga_get_proc_index(g_a, me, proc_index);
        pnga_get_proc_grid(g_a, topology);
        if (!pnga_uses_irreg_proc_grid(g_a)) {
          pnga_get_block_info(g_a, blocks, block_dims);
          /* figure out strides for locally held block of data */
          for (i=0; i<ndim; i++) {
            stride[i] = 0;
            for (j=proc_index[i]; j<blocks[i]; j += topology[i]) {
              min = j*block_dims[i] + 1;
              max = (j+1)*block_dims[i];
              if (max > dims[i])
                max = dims[i];
              stride[i] += (max - min + 1);
            }
          }
          /* use strides to figure out local index */
          l_index[0] = ind%stride[0];
          for (i=1; i<ndim; i++) {
            ind = (ind-l_index[i-1])/stride[i-1];
            l_index[i] = ind%stride[i];
          }
          /* figure out block index for block holding data element */
          for (i=0; i<ndim; i++) {
            index[i] = l_index[i]/block_dims[i];
          }
          for (i=0; i<ndim; i++) {
            lo[i] = (topology[i]*index[i] + proc_index[i])*block_dims[i];
            info.subscr[i] = l_index[i]%block_dims[i] + lo[i];
          }
        } else {
        }
      }
    }
  }
#endif
  /* calculate global result */
  if(type==C_INT){
    int size = sizeof(double) + sizeof(Integer)*(int)ndim;
    armci_msg_sel_scope(SCOPE_ALL,&info,size,op,ARMCI_INT,participate);
    *(int*)val = (int)info.v.ival;
  }else if(type==C_LONG){
    int size = sizeof(double) + sizeof(Integer)*(int)ndim;
    armci_msg_sel_scope(SCOPE_ALL,&info,size,op,ARMCI_LONG,participate);
    *(long*)val = info.v.lval;
  }else if(type==C_LONGLONG){
    int size = sizeof(double) + sizeof(Integer)*(int)ndim;
    armci_msg_sel_scope(SCOPE_ALL,&info,size,op,ARMCI_LONG_LONG,participate);
    *(long long*)val = info.v.llval;
  }else if(type==C_DBL){
    int size = sizeof(double) + sizeof(Integer)*(int)ndim;
    armci_msg_sel_scope(SCOPE_ALL,&info,size,op,ARMCI_DOUBLE,participate);
    *(DoublePrecision*)val = info.v.dval;
  }else if(type==C_FLOAT){
    int size = sizeof(double) + sizeof(Integer)*ndim;
    armci_msg_sel_scope(SCOPE_ALL,&info,size,op,ARMCI_FLOAT,participate);
    *(float*)val = info.v.fval;       
  }else if(type==C_SCPL){
    int size = sizeof(info); /* for simplicity we send entire info */
    armci_msg_sel_scope(SCOPE_ALL,&info,size,op,ARMCI_FLOAT,participate);
    *(SingleComplex*)val = info.extra2;
  }else{
    int size = sizeof(info); /* for simplicity we send entire info */
    armci_msg_sel_scope(SCOPE_ALL,&info,size,op,ARMCI_DOUBLE,participate);
    *(DoubleComplex*)val = info.extra;
  }

  for(i = 0; i < ndim; i++) subscript[i]= info.subscr[i];
}